

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O1

int32_t __thiscall
icu_63::GregorianCalendar::handleGetMonthLength
          (GregorianCalendar *this,int32_t extendedYear,int32_t month)

{
  int32_t iVar1;
  uint uVar2;
  int8_t *piVar3;
  bool bVar4;
  bool bVar5;
  int32_t local_14;
  
  local_14 = month;
  if (0xb < (uint)month) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&local_14);
    extendedYear = extendedYear + iVar1;
  }
  bVar4 = extendedYear < this->fGregorianCutoverYear;
  bVar5 = (extendedYear & 3U) == 0;
  if (bVar5 && !bVar4) {
    uVar2 = extendedYear * -0x3d70a3d7 + 0x51eb850;
    bVar4 = true;
    if ((uVar2 >> 2 | extendedYear * 0x40000000) < 0x28f5c29) {
      bVar4 = (uVar2 >> 4 | extendedYear * -0x70000000) < 0xa3d70b;
    }
  }
  else {
    bVar4 = bVar4 && bVar5;
  }
  piVar3 = "\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f";
  if (bVar4) {
    piVar3 = "\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f";
  }
  return (int)piVar3[local_14];
}

Assistant:

int32_t GregorianCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month)  const
{
    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        extendedYear += ClockMath::floorDivide(month, 12, month);
    }

    return isLeapYear(extendedYear) ? kLeapMonthLength[month] : kMonthLength[month];
}